

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firework.cpp
# Opt level: O2

void __thiscall Firework::explode(Firework *this)

{
  double dVar1;
  double dVar2;
  Rng *this_00;
  int iVar3;
  bool bVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined4 local_68;
  int local_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined4 local_50;
  undefined1 local_48 [16];
  
  this_00 = piksel::Rng::getInstance();
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  piksel::Rng::random(this_00);
  iVar3 = 200;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    local_68 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_64 = 0xffffffff;
    local_60 = 0x3f8000003f800000;
    uStack_58 = 0x3f8000003f800000;
    local_50 = 0x3f800000;
    local_80.field_0 =
         *(anon_struct_8_2_947311e6_for_anon_union_8_4_ea85571f_for_vec<2,_float,_(glm::qualifier)0>_3_0
           *)&(this->rocket).position.field_0;
    piksel::Rng::random(this_00);
    local_60 = CONCAT44(local_60._4_4_,extraout_XMM0_Da_00);
    piksel::Rng::random(this_00);
    piksel::Rng::random(this_00);
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = (double)extraout_XMM0_Da_02;
    local_48._12_4_ = extraout_XMM0_Dd;
    dVar1 = cos((double)extraout_XMM0_Da_01);
    dVar2 = sin((double)extraout_XMM0_Da_01);
    local_78 = CONCAT44((float)((double)local_48._0_8_ * dVar2),
                        (float)((double)local_48._0_8_ * dVar1));
    piksel::Rng::random(this_00);
    local_64 = (int)extraout_XMM0_Da_03;
    local_60 = CONCAT44(extraout_XMM0_Da,(undefined4)local_60);
    local_50 = 0x3f800000;
    std::vector<Particle,_std::allocator<Particle>_>::push_back
              (&this->particles,(value_type *)&local_80.field_0);
  }
  this->exploded = true;
  return;
}

Assistant:

void Firework::explode() {
    piksel::Rng& rng = piksel::Rng::getInstance();
    glm::vec4 color = glm::vec4(rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), rng.random(0.0f, 1.0f), 1.0f);
    for (int i = 0; i < 200; i++) {
        Particle particle;
        particle.position = rocket.position;
        particle.mass = rng.random(0.7, 1.0);
        float angle = rng.random(0.0, piksel::TWO_PI);
        float magnitude = rng.random(2.0f, 10.0f);
        particle.velocity = glm::vec2(magnitude * cos(angle), magnitude * sin(angle));
        particle.lifespan = rng.random(90.0f, 110.0f);
        particle.color = color;
        particles.push_back(particle);
    }
    exploded = true;
}